

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  ZSTD_dStage ZVar1;
  ZSTD_dStreamStage ZVar2;
  size_t err_code;
  size_t sVar3;
  size_t dstCapacity;
  
  ZVar1 = zds->stage;
  if (zds->outBufferMode == ZSTD_bm_buffered) {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar3 = zds->outStart;
      dstCapacity = 0;
    }
    else {
      sVar3 = zds->outStart;
      dstCapacity = zds->outBuffSize - sVar3;
    }
    sVar3 = ZSTD_decompressContinue(zds,zds->outBuff + sVar3,dstCapacity,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    if ((ZVar1 == ZSTDds_skipFrame) || (sVar3 != 0)) {
      zds->outEnd = zds->outStart + sVar3;
      ZVar2 = zdss_flush;
      goto LAB_00579e10;
    }
  }
  else {
    sVar3 = 0;
    if (ZVar1 != ZSTDds_skipFrame) {
      sVar3 = (long)oend - (long)*op;
    }
    sVar3 = ZSTD_decompressContinue(zds,*op,sVar3,src,srcSize);
    if (0xffffffffffffff88 < sVar3) {
      return sVar3;
    }
    *op = *op + sVar3;
  }
  ZVar2 = zdss_read;
LAB_00579e10:
  zds->streamStage = ZVar2;
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}